

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::CalculatePosition
          (SscWriterGeneric *this,BlockVecVec *writerVecVec,BlockVecVec *readerVecVec,int writerRank
          ,RankPosMap *allOverlapRanks)

{
  int iVar1;
  bool bVar2;
  reference ppVar3;
  reference localVec;
  size_type sVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *in_RDX;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *in_RSI;
  size_t currentRankTotalSize;
  value_type *bv;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *r;
  iterator __end5;
  iterator __begin5;
  RankPosMap *__range5;
  bool hasOverlap;
  int rank;
  size_t bufferPosition;
  RankPosMap currentReaderOverlapWriterRanks;
  value_type *readerRankMap;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *overlapRank;
  iterator __end3;
  iterator __begin3;
  RankPosMap *__range3;
  mapped_type *in_stack_fffffffffffffee8;
  mapped_type *in_stack_fffffffffffffef0;
  BlockVec *bv_00;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_b0;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_a8;
  undefined1 *local_a0;
  byte local_95;
  int local_94;
  BlockVec *local_90;
  undefined1 local_88 [56];
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_38 [4];
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *local_18;
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::begin((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_fffffffffffffee8);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::end((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)in_stack_fffffffffffffee8);
  do {
    bVar2 = std::__detail::operator!=(local_38,&local_40);
    if (!bVar2) {
      return;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                          *)0x1d39d3);
    localVec = std::
               vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
               ::operator[](local_18,(long)ppVar3->first);
    CalculateOverlap((BlockVecVec *)ppVar3,localVec);
    local_90 = (BlockVec *)0x0;
    for (local_94 = 0; iVar1 = local_94,
        sVar4 = std::
                vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                ::size(local_10), iVar1 < (int)sVar4; local_94 = local_94 + 1) {
      local_95 = 0;
      local_a0 = local_88;
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::begin((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)in_stack_fffffffffffffee8);
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::end((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffee8);
      while (bVar2 = std::__detail::operator!=(&local_a8,&local_b0), bVar2) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                              *)0x1d3aa8);
        if (ppVar3->first == local_94) {
          local_95 = 1;
          break;
        }
        std::__detail::
        _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                      *)in_stack_fffffffffffffef0);
      }
      if ((local_95 & 1) != 0) {
        bv_00 = local_90;
        pmVar5 = std::
                 unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 ::operator[]((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
        pmVar5->first = (unsigned_long)bv_00;
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[](local_10,(long)local_94);
        sVar6 = TotalDataSize(bv_00);
        pmVar5 = std::
                 unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 ::operator[]((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
        pmVar5->second = sVar6 + 1;
        local_90 = (BlockVec *)
                   ((long)&(local_90->
                           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start + sVar6 + 1);
      }
    }
    in_stack_fffffffffffffef0 =
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::operator[]((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 =
         std::
         unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::operator[]((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    std::pair<unsigned_long,_unsigned_long>::operator=
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
    std::
    unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~unordered_map((unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)0x1d3c28);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                *)in_stack_fffffffffffffef0);
  } while( true );
}

Assistant:

void SscWriterGeneric::CalculatePosition(ssc::BlockVecVec &writerVecVec,
                                         ssc::BlockVecVec &readerVecVec, const int writerRank,
                                         ssc::RankPosMap &allOverlapRanks)
{
    for (auto &overlapRank : allOverlapRanks)
    {
        auto &readerRankMap = readerVecVec[overlapRank.first];
        auto currentReaderOverlapWriterRanks = CalculateOverlap(writerVecVec, readerRankMap);
        size_t bufferPosition = 0;
        for (int rank = 0; rank < static_cast<int>(writerVecVec.size()); ++rank)
        {
            bool hasOverlap = false;
            for (const auto &r : currentReaderOverlapWriterRanks)
            {
                if (r.first == rank)
                {
                    hasOverlap = true;
                    break;
                }
            }
            if (hasOverlap)
            {
                currentReaderOverlapWriterRanks[rank].first = bufferPosition;
                auto &bv = writerVecVec[rank];
                size_t currentRankTotalSize = TotalDataSize(bv) + 1;
                currentReaderOverlapWriterRanks[rank].second = currentRankTotalSize;
                bufferPosition += currentRankTotalSize;
            }
        }
        allOverlapRanks[overlapRank.first] = currentReaderOverlapWriterRanks[writerRank];
    }
}